

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Callback.cpp
# Opt level: O1

void __thiscall Callback::Emitter::~Emitter(Emitter *this)

{
  usize *puVar1;
  SignalActivation *pSVar2;
  Item *pIVar3;
  Listener *pLVar4;
  Item *pIVar5;
  Item *pIVar6;
  offset_in_MemberFuncPtr_to_subr oVar7;
  Item *pIVar8;
  ItemBlock *pIVar9;
  ItemBlock *pIVar10;
  ItemBlock *pIVar11;
  ItemBlock *pIVar12;
  MemberFuncPtr *signal;
  Item *pIVar13;
  Slot *slotData;
  Item *pIVar14;
  Item *pIVar15;
  Item *item;
  Item *pIVar16;
  long lVar17;
  Iterator *pIVar18;
  Item *pIVar19;
  bool bVar20;
  
  pIVar19 = (this->signalData)._end.item;
  pIVar13 = (this->signalData)._begin.item;
  if (pIVar19 == pIVar13) {
    for (pIVar19 = (this->signalData)._begin.item; pIVar19 != &(this->signalData).endItem;
        pIVar19 = pIVar19->next) {
      pIVar9 = (pIVar19->value).slots.blocks;
      while (pIVar9 != (ItemBlock *)0x0) {
        pIVar10 = pIVar9->next;
        operator_delete__(pIVar9);
        pIVar9 = pIVar10;
      }
    }
    pIVar12 = (this->signalData).blocks;
    while (pIVar12 != (ItemBlock *)0x0) {
      pIVar11 = pIVar12->next;
      operator_delete__(pIVar12);
      pIVar12 = pIVar11;
    }
    pIVar9 = (this->signalData).endItem.value.slots.blocks;
    while (pIVar9 != (ItemBlock *)0x0) {
      pIVar10 = pIVar9->next;
      operator_delete__(pIVar9);
      pIVar9 = pIVar10;
    }
    return;
  }
  do {
    pSVar2 = (pIVar13->value).activation;
    if (pSVar2 != (SignalActivation *)0x0) {
      pSVar2->invalidated = true;
    }
    pIVar3 = (pIVar13->value).slots._end.item;
    for (pIVar14 = (pIVar13->value).slots._begin.item; pIVar14 != pIVar3; pIVar14 = pIVar14->next) {
      if ((pIVar14->value).state != disconnected) {
        pLVar4 = (pIVar14->value).receiver;
        pIVar15 = (pLVar4->slotData).root;
        bVar20 = pIVar15 == (Item *)0x0;
        if (!bVar20) {
          bVar20 = false;
          do {
            lVar17 = 0x70;
            if ((this <= pIVar15->key) && (lVar17 = 0x68, pIVar15->key <= this)) break;
            pIVar15 = *(Item **)((long)&pIVar15->key + lVar17);
            bVar20 = pIVar15 == (Item *)0x0;
          } while (!bVar20);
        }
        pIVar5 = (pLVar4->slotData)._end.item;
        if (bVar20) {
          pIVar15 = pIVar5;
        }
        if (pIVar15 != pIVar5) {
          pIVar6 = (pIVar15->value)._end.item;
          pIVar16 = (pIVar15->value)._begin.item;
          if (pIVar6 != pIVar16) {
            do {
              oVar7 = (pIVar16->value).signal.ptr;
              if ((oVar7 == (pIVar13->key).ptr) &&
                 (oVar7 == 0 ||
                  *(long *)&(pIVar16->value).signal.field_0x8 == *(long *)&(pIVar13->key).field_0x8)
                 ) {
                oVar7 = (pIVar16->value).slot.ptr;
                if ((oVar7 == (pIVar14->value).slot.ptr) &&
                   (oVar7 == 0 ||
                    *(long *)&(pIVar16->value).slot.field_0x8 ==
                    *(long *)&(pIVar14->value).slot.field_0x8)) {
                  pIVar6 = pIVar16->prev;
                  pIVar8 = pIVar16->next;
                  pIVar18 = (Iterator *)&pIVar6->next;
                  if (pIVar6 == (Item *)0x0) {
                    pIVar18 = &(pIVar15->value)._begin;
                  }
                  pIVar18->item = pIVar8;
                  pIVar8->prev = pIVar6;
                  puVar1 = &(pIVar15->value)._size;
                  *puVar1 = *puVar1 - 1;
                  pIVar16->prev = (pIVar15->value).freeItem;
                  (pIVar15->value).freeItem = pIVar16;
                  break;
                }
              }
              pIVar16 = pIVar16->next;
            } while (pIVar16 != pIVar6);
          }
        }
      }
    }
    pIVar13 = pIVar13->next;
    if (pIVar13 == pIVar19) {
      Map<Callback::MemberFuncPtr,_Callback::Emitter::SignalData>::~Map(&this->signalData);
      return;
    }
  } while( true );
}

Assistant:

Callback::Emitter::~Emitter()
{
  for(Map<MemberFuncPtr, SignalData>::Iterator i = signalData.begin(); i != signalData.end(); ++i)
  {
    const MemberFuncPtr& signal = i.key();
    SignalData& data = *i;
    if(data.activation)
      data.activation->invalidated = true;
    for(List<Slot>::Iterator i = data.slots.begin(), end = data.slots.end(); i != end; ++i)
    {
      Slot& slotData = *i;
      if(slotData.state == Slot::disconnected)
        continue;
      Map<Callback::Emitter*, List<Callback::Listener::Signal> >::Iterator it = slotData.receiver->slotData.find(this);
      if(it != slotData.receiver->slotData.end())
      {
        List<Callback::Listener::Signal>& signals = *it;
        for(List<Callback::Listener::Signal>::Iterator i = signals.begin(); i != signals.end(); ++i)
          if(i->signal == signal && i->slot == slotData.slot)
          {
            signals.remove(i);
            break;
          }
      }
    }
  }
}